

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s5.c
# Opt level: O2

char * s5_strerror(s5_err err)

{
  if ((uint)(err + s5_exec_cmd) < 7) {
    return &DAT_001230dc + *(int *)(&DAT_001230dc + (ulong)(uint)(err + s5_exec_cmd) * 4);
  }
  return "Unknown error.";
}

Assistant:

const char *s5_strerror(s5_err err) {
#define S5_ERR_GEN(_, name, errmsg) case s5_ ## name: return errmsg;
  switch (err) {
    S5_ERR_MAP(S5_ERR_GEN)
    default: ;  /* Silence s5_max_errors -Wswitch warning. */
  }
#undef S5_ERR_GEN
  return "Unknown error.";
}